

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::report_race_locked
          (Fasttrack<std::shared_mutex> *this,uint32_t thr1,uint32_t thr2,bool wr1,bool wr2,
          VarState *var,size_t addr)

{
  lock_guard<std::shared_mutex> local_30;
  lock_guard<std::shared_mutex> lg;
  VarState *var_local;
  bool wr2_local;
  bool wr1_local;
  uint32_t thr2_local;
  uint32_t thr1_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  lg._M_device = (mutex_type *)var;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_30,&this->g_lock);
  report_race(this,thr1,thr2,wr1,wr2,(VarState *)lg._M_device,addr);
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void report_race_locked(uint32_t thr1, uint32_t thr2, bool wr1, bool wr2,
                          const VarState& var, size_t addr) {
    std::lock_guard<LockT> lg(g_lock);
    report_race(thr1, thr2, wr1, wr2, var, addr);
  }